

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_ctzi_i32_mipsel(TCGContext_conflict4 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg1,uint32_t arg2)

{
  TCGv_i32 arg2_00;
  TCGv_i32 t;
  uint32_t arg2_local;
  TCGv_i32 arg1_local;
  TCGv_i32 ret_local;
  TCGContext_conflict4 *tcg_ctx_local;
  
  arg2_00 = tcg_const_i32_mipsel(tcg_ctx,arg2);
  tcg_gen_ctz_i32_mipsel(tcg_ctx,ret,arg1,arg2_00);
  tcg_temp_free_i32(tcg_ctx,arg2_00);
  return;
}

Assistant:

void tcg_gen_ctzi_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg1, uint32_t arg2)
{
    if (!TCG_TARGET_HAS_ctz_i32 && TCG_TARGET_HAS_ctpop_i32 && arg2 == 32) {
        /* This equivalence has the advantage of not requiring a fixup.  */
        TCGv_i32 t = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_subi_i32(tcg_ctx, t, arg1, 1);
        tcg_gen_andc_i32(tcg_ctx, t, t, arg1);
        tcg_gen_ctpop_i32(tcg_ctx, ret, t);
        tcg_temp_free_i32(tcg_ctx, t);
    } else {
        TCGv_i32 t = tcg_const_i32(tcg_ctx, arg2);
        tcg_gen_ctz_i32(tcg_ctx, ret, arg1, t);
        tcg_temp_free_i32(tcg_ctx, t);
    }
}